

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_box.cpp
# Opt level: O1

void Omega_h::make_1d_box(Real x,LO nx,LOs *ev2v_out,Reals *coords_out)

{
  int *piVar1;
  size_type sVar2;
  ulong uVar3;
  int iVar4;
  IntIterator last;
  Alloc *pAVar5;
  IntIterator last_1;
  double dVar6;
  type fill_coords;
  type fill_conn;
  Write<int> ev2v;
  Write<double> coords;
  Read<signed_char> local_c8;
  string local_b0;
  string local_90;
  Write<int> local_70;
  Write<double> local_60;
  Write<double> local_50;
  Write<int> local_40;
  double local_30;
  
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
  iVar4 = nx + 1;
  Write<double>::Write(&local_60,iVar4,&local_b0);
  dVar6 = (double)nx;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    local_30 = (double)nx;
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    dVar6 = local_30;
  }
  local_b0.field_2._8_8_ = x / dVar6;
  local_b0._M_dataplus._M_p._0_4_ = iVar4;
  local_b0._M_string_length = (size_type)local_60.shared_alloc_.alloc;
  if (((ulong)local_60.shared_alloc_.alloc & 7) == 0 && local_60.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_b0._M_string_length = (local_60.shared_alloc_.alloc)->size * 8 + 1;
    }
    else {
      (local_60.shared_alloc_.alloc)->use_count = (local_60.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_b0.field_2._M_allocated_capacity = (size_type)local_60.shared_alloc_.direct_ptr;
  pAVar5 = (Alloc *)local_b0._M_string_length;
  if ((local_b0._M_string_length & 7) == 0 && (Alloc *)local_b0._M_string_length != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      pAVar5 = (Alloc *)(*(size_t *)local_b0._M_string_length * 8 + 1);
    }
    else {
      *(int *)(local_b0._M_string_length + 0x30) = *(int *)(local_b0._M_string_length + 0x30) + 1;
    }
  }
  if (-1 < nx) {
    if (((ulong)pAVar5 & 7) == 0 && pAVar5 != (Alloc *)0x0) {
      pAVar5->use_count = pAVar5->use_count + -1;
      pAVar5 = (Alloc *)(pAVar5->size * 8 + 1);
    }
    entering_parallel = '\0';
    uVar3 = 0;
    do {
      *(double *)((long)local_60.shared_alloc_.direct_ptr + uVar3 * 8) =
           (double)(int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) %
                        (long)iVar4) * (double)local_b0.field_2._8_8_;
      uVar3 = uVar3 + 1;
    } while (iVar4 != (int)uVar3);
    if (((ulong)pAVar5 & 7) == 0 && pAVar5 != (Alloc *)0x0) {
      piVar1 = &pAVar5->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar5);
        operator_delete(pAVar5,0x48);
      }
    }
    pAVar5 = (Alloc *)0x0;
  }
  if (((ulong)pAVar5 & 7) == 0 && pAVar5 != (Alloc *)0x0) {
    piVar1 = &pAVar5->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar5);
      operator_delete(pAVar5,0x48);
    }
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
  Write<int>::Write(&local_70,nx * 2,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  local_90._M_dataplus._M_p._0_4_ = nx;
  local_90._M_string_length = (size_type)local_70.shared_alloc_.alloc;
  if (((ulong)local_70.shared_alloc_.alloc & 7) == 0 && local_70.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_90._M_string_length = (local_70.shared_alloc_.alloc)->size * 8 + 1;
    }
    else {
      (local_70.shared_alloc_.alloc)->use_count = (local_70.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_90.field_2._M_allocated_capacity = (size_type)local_70.shared_alloc_.direct_ptr;
  pAVar5 = (Alloc *)local_90._M_string_length;
  if ((local_90._M_string_length & 7) == 0 && (Alloc *)local_90._M_string_length != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      pAVar5 = (Alloc *)(*(size_t *)local_90._M_string_length * 8 + 1);
    }
    else {
      *(int *)(local_90._M_string_length + 0x30) = *(int *)(local_90._M_string_length + 0x30) + 1;
    }
  }
  if (0 < nx) {
    if (((ulong)pAVar5 & 7) == 0 && pAVar5 != (Alloc *)0x0) {
      pAVar5->use_count = pAVar5->use_count + -1;
      pAVar5 = (Alloc *)(pAVar5->size * 8 + 1);
    }
    entering_parallel = '\0';
    uVar3 = 0;
    do {
      iVar4 = (int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) %
                   (long)nx);
      *(int *)((long)local_70.shared_alloc_.direct_ptr + uVar3 * 8) = iVar4;
      *(int *)((long)local_70.shared_alloc_.direct_ptr + uVar3 * 8 + 4) = iVar4 + 1;
      uVar3 = uVar3 + 1;
    } while (nx != (int)uVar3);
    if (((ulong)pAVar5 & 7) == 0 && pAVar5 != (Alloc *)0x0) {
      piVar1 = &pAVar5->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar5);
        operator_delete(pAVar5,0x48);
      }
    }
    pAVar5 = (Alloc *)0x0;
  }
  if (((ulong)pAVar5 & 7) == 0 && pAVar5 != (Alloc *)0x0) {
    piVar1 = &pAVar5->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar5);
      operator_delete(pAVar5,0x48);
    }
  }
  local_40.shared_alloc_.alloc = local_70.shared_alloc_.alloc;
  if (((ulong)local_70.shared_alloc_.alloc & 7) == 0 && local_70.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_40.shared_alloc_.alloc = (Alloc *)((local_70.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_70.shared_alloc_.alloc)->use_count = (local_70.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_40.shared_alloc_.direct_ptr = local_70.shared_alloc_.direct_ptr;
  Read<int>::Read(&local_c8,&local_40);
  pAVar5 = (ev2v_out->write_).shared_alloc_.alloc;
  if (((ulong)pAVar5 & 7) == 0 && pAVar5 != (Alloc *)0x0) {
    piVar1 = &pAVar5->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar5);
      operator_delete(pAVar5,0x48);
    }
  }
  pAVar5 = local_40.shared_alloc_.alloc;
  (ev2v_out->write_).shared_alloc_.alloc = local_c8.write_.shared_alloc_.alloc;
  (ev2v_out->write_).shared_alloc_.direct_ptr = local_c8.write_.shared_alloc_.direct_ptr;
  if ((((ulong)local_c8.write_.shared_alloc_.alloc & 7) == 0 &&
       local_c8.write_.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_c8.write_.shared_alloc_.alloc)->use_count =
         (local_c8.write_.shared_alloc_.alloc)->use_count + -1;
    (ev2v_out->write_).shared_alloc_.alloc =
         (Alloc *)((local_c8.write_.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_c8.write_.shared_alloc_.alloc = (Alloc *)0x0;
  local_c8.write_.shared_alloc_.direct_ptr = (void *)0x0;
  if (((ulong)local_40.shared_alloc_.alloc & 7) == 0 && local_40.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_40.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_40.shared_alloc_.alloc);
      operator_delete(pAVar5,0x48);
    }
  }
  local_50.shared_alloc_.alloc = local_60.shared_alloc_.alloc;
  if (((ulong)local_60.shared_alloc_.alloc & 7) == 0 && local_60.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_50.shared_alloc_.alloc = (Alloc *)((local_60.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_60.shared_alloc_.alloc)->use_count = (local_60.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_50.shared_alloc_.direct_ptr = local_60.shared_alloc_.direct_ptr;
  Read<double>::Read(&local_c8,&local_50);
  pAVar5 = (coords_out->write_).shared_alloc_.alloc;
  if (((ulong)pAVar5 & 7) == 0 && pAVar5 != (Alloc *)0x0) {
    piVar1 = &pAVar5->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar5);
      operator_delete(pAVar5,0x48);
    }
  }
  pAVar5 = local_50.shared_alloc_.alloc;
  (coords_out->write_).shared_alloc_.alloc = local_c8.write_.shared_alloc_.alloc;
  (coords_out->write_).shared_alloc_.direct_ptr = local_c8.write_.shared_alloc_.direct_ptr;
  if ((((ulong)local_c8.write_.shared_alloc_.alloc & 7) == 0 &&
       local_c8.write_.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_c8.write_.shared_alloc_.alloc)->use_count =
         (local_c8.write_.shared_alloc_.alloc)->use_count + -1;
    (coords_out->write_).shared_alloc_.alloc =
         (Alloc *)((local_c8.write_.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_c8.write_.shared_alloc_.alloc = (Alloc *)0x0;
  local_c8.write_.shared_alloc_.direct_ptr = (void *)0x0;
  if (((ulong)local_50.shared_alloc_.alloc & 7) == 0 && local_50.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_50.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_50.shared_alloc_.alloc);
      operator_delete(pAVar5,0x48);
    }
  }
  sVar2 = local_90._M_string_length;
  if ((local_90._M_string_length & 7) == 0 && (Alloc *)local_90._M_string_length != (Alloc *)0x0) {
    piVar1 = (int *)(local_90._M_string_length + 0x30);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)local_90._M_string_length);
      operator_delete((void *)sVar2,0x48);
    }
  }
  if (((ulong)local_70.shared_alloc_.alloc & 7) == 0 && local_70.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_70.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_70.shared_alloc_.alloc);
      operator_delete(local_70.shared_alloc_.alloc,0x48);
    }
  }
  sVar2 = local_b0._M_string_length;
  if ((local_b0._M_string_length & 7) == 0 && (Alloc *)local_b0._M_string_length != (Alloc *)0x0) {
    piVar1 = (int *)(local_b0._M_string_length + 0x30);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)local_b0._M_string_length);
      operator_delete((void *)sVar2,0x48);
    }
  }
  if (((ulong)local_60.shared_alloc_.alloc & 7) == 0 && local_60.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_60.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_60.shared_alloc_.alloc);
      operator_delete(local_60.shared_alloc_.alloc,0x48);
    }
  }
  return;
}

Assistant:

void make_1d_box(Real x, LO nx, LOs* ev2v_out, Reals* coords_out) {
  LO ne = nx;
  LO nv = nx + 1;
  Real dx = x / nx;
  Write<Real> coords(nv);
  auto fill_coords = OMEGA_H_LAMBDA(LO v) {
    LO i = v % nv;
    coords[v] = i * dx;
  };
  parallel_for(nv, fill_coords, "make_1d_box(coords)");
  Write<LO> ev2v(ne * 2);
  auto fill_conn = OMEGA_H_LAMBDA(LO q) {
    LO i = q % ne;
    ev2v[q * 2 + 0] = i + 0;
    ev2v[q * 2 + 1] = i + 1;
  };
  parallel_for(ne, fill_conn, "make_1d_box(conn)");
  *ev2v_out = ev2v;
  *coords_out = coords;
}